

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

int Sfm_LibImplementGatesDelay
              (Sfm_Lib_t *p,int *pFanins,Mio_Gate_t *pGateB,Mio_Gate_t *pGateT,char *pFansB,
              char *pFansT,Vec_Int_t *vGates,Vec_Wec_t *vFanins)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int local_4c;
  int nFanins;
  int i;
  Vec_Int_t *vLevel;
  char *pFansT_local;
  char *pFansB_local;
  Mio_Gate_t *pGateT_local;
  Mio_Gate_t *pGateB_local;
  int *pFanins_local;
  Sfm_Lib_t *p_local;
  
  iVar1 = Mio_GateReadValue(pGateB);
  Vec_IntPush(vGates,iVar1);
  pVVar3 = Vec_WecPushLevel(vFanins);
  iVar1 = Mio_GateReadPinNum(pGateB);
  for (local_4c = 0; local_4c < iVar1; local_4c = local_4c + 1) {
    Vec_IntPush(pVVar3,pFanins[(int)pFansB[local_4c]]);
  }
  if (pGateT == (Mio_Gate_t *)0x0) {
    p_local._4_4_ = 1;
  }
  else {
    iVar1 = Mio_GateReadValue(pGateT);
    Vec_IntPush(vGates,iVar1);
    pVVar3 = Vec_WecPushLevel(vFanins);
    iVar1 = Mio_GateReadPinNum(pGateT);
    for (local_4c = 0; local_4c < iVar1; local_4c = local_4c + 1) {
      if (pFansT[local_4c] == '\x10') {
        iVar2 = Vec_WecSize(vFanins);
        Vec_IntPush(pVVar3,iVar2 + -2);
      }
      else {
        Vec_IntPush(pVVar3,pFanins[(int)pFansT[local_4c]]);
      }
    }
    p_local._4_4_ = 2;
  }
  return p_local._4_4_;
}

Assistant:

int Sfm_LibImplementGatesDelay( Sfm_Lib_t * p, int * pFanins, Mio_Gate_t * pGateB, Mio_Gate_t * pGateT, char * pFansB, char * pFansT, Vec_Int_t * vGates, Vec_Wec_t * vFanins )
{
    Vec_Int_t * vLevel;
    int i, nFanins;
    // create bottom gate
    Vec_IntPush( vGates, Mio_GateReadValue(pGateB) );
    vLevel  = Vec_WecPushLevel( vFanins );
    nFanins = Mio_GateReadPinNum( pGateB );
    for ( i = 0; i < nFanins; i++ )
        Vec_IntPush( vLevel, pFanins[(int)pFansB[i]] );
    if ( pGateT == NULL )
        return 1;
    // create top gate
    Vec_IntPush( vGates, Mio_GateReadValue(pGateT) );
    vLevel  = Vec_WecPushLevel( vFanins );
    nFanins = Mio_GateReadPinNum( pGateT );
    for ( i = 0; i < nFanins; i++ )
        if ( pFansT[i] == (char)16 )
            Vec_IntPush( vLevel, Vec_WecSize(vFanins)-2 );
        else
            Vec_IntPush( vLevel, pFanins[(int)pFansT[i]] );
    return 2;
}